

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestRequired * __thiscall
proto2_unittest::TestRequiredMessage::_internal_mutable_required_message(TestRequiredMessage *this)

{
  Arena *arena;
  TestRequired *pTVar1;
  TestRequired *p;
  TestRequiredMessage *this_local;
  
  if ((this->field_0)._impl_.required_message_ == (TestRequired *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestRequired *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestRequired>(arena);
    (this->field_0)._impl_.required_message_ = pTVar1;
  }
  return (this->field_0)._impl_.required_message_;
}

Assistant:

inline ::proto2_unittest::TestRequired* PROTOBUF_NONNULL TestRequiredMessage::_internal_mutable_required_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.required_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestRequired>(GetArena());
    _impl_.required_message_ = reinterpret_cast<::proto2_unittest::TestRequired*>(p);
  }
  return _impl_.required_message_;
}